

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

void __thiscall IopSpace::restoreXml(IopSpace *this,Element *el)

{
  LowlevelError *this_00;
  allocator local_39;
  string local_38 [32];
  Element *local_18;
  Element *el_local;
  IopSpace *this_local;
  
  local_18 = el;
  el_local = (Element *)this;
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Should never restore iop space from XML",&local_39);
  LowlevelError::LowlevelError(this_00,(string *)local_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void IopSpace::restoreXml(const Element *el)

{
  throw LowlevelError("Should never restore iop space from XML");
}